

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.h
# Opt level: O2

DWARFDie __thiscall llvm::DWARFUnit::getDIEForOffset(DWARFUnit *this,uint64_t Offset)

{
  iterator iVar1;
  DWARFDie DVar2;
  
  extractDIEsIfNeeded(this,false);
  if ((this->DieArray).
      super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->DieArray).
      super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    iVar1 = partition_point<std::vector<llvm::DWARFDebugInfoEntry,std::allocator<llvm::DWARFDebugInfoEntry>>&,llvm::DWARFUnit::getDIEForOffset(unsigned_long)::_lambda(llvm::DWARFDebugInfoEntry_const&)_1_,llvm::DWARFDebugInfoEntry&>
                      (&this->DieArray,(anon_class_8_1_2dc041f1)Offset);
    if ((iVar1._M_current ==
         (this->DieArray).
         super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>.
         _M_impl.super__Vector_impl_data._M_finish) || ((iVar1._M_current)->Offset != Offset)) {
      iVar1._M_current = (DWARFDebugInfoEntry *)0x0;
      this = (DWARFUnit *)0x0;
    }
    DVar2.Die = iVar1._M_current;
    DVar2.U = this;
    return DVar2;
  }
  __assert_fail("!DieArray.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/DebugInfo/DWARF/DWARFUnit.h"
                ,0x1dc,"DWARFDie llvm::DWARFUnit::getDIEForOffset(uint64_t)");
}

Assistant:

DWARFDie getDIEForOffset(uint64_t Offset) {
    extractDIEsIfNeeded(false);
    assert(!DieArray.empty());
    auto It =
        llvm::partition_point(DieArray, [=](const DWARFDebugInfoEntry &DIE) {
          return DIE.getOffset() < Offset;
        });
    if (It != DieArray.end() && It->getOffset() == Offset)
      return DWARFDie(this, &*It);
    return DWARFDie();
  }